

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointToArcTangents.cpp
# Opt level: O2

int GeoCalcs::PointToArcTangents
              (LLPoint *point,LLPoint *center,double radius,LLPoint *tanPt1,LLPoint *tanPt2,
              double dTol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  LLPoint LVar6;
  InverseResult result;
  
  result.azimuth = 0.0;
  result.reverseAzimuth = 0.0;
  result.distance = 0.0;
  DistVincenty(point,center,&result);
  dVar2 = result.reverseAzimuth;
  if (dTol <= ABS(result.distance - radius)) {
    iVar3 = 0;
    if (radius <= result.distance) {
      dVar5 = tan(radius / kSphereRadius);
      dVar1 = tan(result.distance / kSphereRadius);
      dVar5 = acos(dVar5 / dVar1);
      dVar1 = 0.0;
      uVar4 = 0;
      while ((uVar4 == 0 || ((uVar4 < 0xf && (dTol < ABS(dVar1)))))) {
        LVar6 = DestVincenty(center,dVar2 + dVar5,radius);
        tanPt1->latitude = LVar6.latitude;
        tanPt1->longitude = LVar6.longitude;
        DistVincenty(tanPt1,center,&result);
        dVar1 = result.azimuth;
        DistVincenty(tanPt1,point,&result);
        dVar1 = SignAzimuthDifference(dVar1,result.azimuth);
        dVar1 = ABS(dVar1) + -1.5707963267948966;
        dVar5 = dVar5 + dVar1;
        uVar4 = uVar4 + 1;
      }
      dVar1 = 0.0;
      uVar4 = 0;
      iVar3 = 1;
      while ((uVar4 == 0 || ((uVar4 < 0xf && (dTol < ABS(dVar1)))))) {
        LVar6 = DestVincenty(center,dVar2 - dVar5,radius);
        tanPt2->latitude = LVar6.latitude;
        tanPt2->longitude = LVar6.longitude;
        DistVincenty(tanPt2,center,&result);
        dVar1 = result.azimuth;
        DistVincenty(tanPt2,point,&result);
        dVar1 = SignAzimuthDifference(dVar1,result.azimuth);
        dVar1 = ABS(dVar1) + -1.5707963267948966;
        dVar5 = dVar5 + dVar1;
        uVar4 = uVar4 + 1;
      }
    }
  }
  else {
    dVar2 = point->longitude;
    tanPt1->latitude = point->latitude;
    tanPt1->longitude = dVar2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int PointToArcTangents(const LLPoint &point, const LLPoint &center, double radius,
                           LLPoint &tanPt1, LLPoint &tanPt2, double dTol)
    {
        InverseResult result;
        DistVincenty(point, center, result);
        const double crsFromCenter = result.reverseAzimuth;

        if (fabs(result.distance - radius) < dTol)
        {
            tanPt1 = point;
            return 1;
        }

        if (result.distance < radius)
        {
            return 0;
        }

        double c = acos(tan(radius / kSphereRadius) / tan(result.distance / kSphereRadius));
        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            tanPt1 = DestVincenty(center, crsFromCenter + c, radius);
            DistVincenty(tanPt1, center, result);
            const double radCrs = result.azimuth;

            DistVincenty(tanPt1, point, result);
            dErr = fabs(SignAzimuthDifference(radCrs, result.azimuth)) - M_PI_2;
            c = c + dErr;
            k++;
        }

        k = 0;
        dErr = 0.0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            tanPt2 = DestVincenty(center, crsFromCenter - c, radius);
            DistVincenty(tanPt2, center, result);
            const double radCrs = result.azimuth;

            DistVincenty(tanPt2, point, result);
            dErr = fabs(SignAzimuthDifference(radCrs, result.azimuth)) - M_PI_2;
            c = c + dErr;
            k++;
        }

        return 1;
    }